

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_wall_distance(REF_GRID_conflict ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  size_t __size;
  REF_INT item;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB *pRVar1;
  undefined1 auVar2 [16];
  uint max_ncell;
  int iVar3;
  int iVar4;
  uint uVar5;
  REF_INT *send_size;
  REF_INT *recv_size;
  void *__s;
  long lVar6;
  void *pvVar7;
  REF_DBL *pRVar8;
  undefined4 *__ptr;
  REF_INT *part_ncell;
  REF_INT *permutation;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  REF_DBL *distance_00;
  int iVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  REF_DBL **ppRVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  REF_DBL *xyz;
  REF_INT part_complete;
  REF_INT ncell;
  REF_SEARCH ref_search;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_DBL radius;
  REF_DBL *local_xyz;
  REF_DBL center [3];
  REF_DBL **in_stack_fffffffffffffed0;
  ulong local_e8;
  REF_DBL **local_d0;
  REF_INT local_c8;
  uint local_c4;
  REF_DBL *local_c0;
  REF_SEARCH local_b8;
  REF_DBL *local_b0;
  void *local_a8;
  ulong local_a0;
  REF_DBL *local_98;
  void *local_90;
  int local_84;
  uint local_80;
  REF_INT local_7c;
  REF_GRID_conflict local_78;
  ulong local_70;
  ulong local_68;
  REF_DBL **local_60;
  double local_58;
  REF_DBL *local_50;
  REF_DBL local_48 [3];
  
  ref_mpi = ref_grid->mpi;
  max_ncell = (ref_grid->twod == 0) + 2;
  uVar5 = ref_mpi->n;
  uVar21 = (ulong)uVar5;
  if ((int)uVar5 < 0) {
    pcVar15 = "malloc a_size of REF_INT negative";
    uVar13 = 0x6dc;
    goto LAB_001c800d;
  }
  ref_node = ref_grid->node;
  __size = uVar21 * 4;
  local_78 = ref_grid;
  send_size = (REF_INT *)malloc(__size);
  auVar2 = _DAT_002034c0;
  if (send_size == (REF_INT *)0x0) {
    pcVar15 = "malloc a_size of REF_INT NULL";
    uVar13 = 0x6dc;
    goto LAB_001c8264;
  }
  if (uVar21 == 0) {
    recv_size = (REF_INT *)malloc(__size);
    if (recv_size == (REF_INT *)0x0) goto LAB_001c8195;
  }
  else {
    lVar11 = uVar21 - 1;
    auVar30._8_4_ = (int)lVar11;
    auVar30._0_8_ = lVar11;
    auVar30._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar30 = auVar30 ^ _DAT_002034c0;
    auVar29 = _DAT_002034e0;
    auVar25 = _DAT_002034b0;
    do {
      auVar28 = auVar25 ^ auVar2;
      iVar3 = auVar30._0_4_;
      iVar9 = auVar30._4_4_;
      iVar4 = auVar30._12_4_;
      if ((bool)(~(auVar28._4_4_ == iVar9 && iVar3 < auVar28._0_4_ || iVar9 < auVar28._4_4_) & 1)) {
        *(undefined4 *)((long)send_size + lVar11) = 0;
      }
      if ((auVar28._12_4_ != iVar4 || auVar28._8_4_ <= auVar30._8_4_) && auVar28._12_4_ <= iVar4) {
        *(undefined4 *)((long)send_size + lVar11 + 4) = 0;
      }
      auVar28 = auVar29 ^ auVar2;
      iVar10 = auVar28._4_4_;
      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar28._0_4_ <= iVar3)) {
        *(undefined4 *)((long)send_size + lVar11 + 8) = 0;
        *(undefined4 *)((long)send_size + lVar11 + 0xc) = 0;
      }
      lVar6 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar6 + 4;
      lVar6 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar6 + 4;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar11);
    recv_size = (REF_INT *)malloc(__size);
    auVar2 = _DAT_002034c0;
    if (recv_size == (REF_INT *)0x0) {
LAB_001c8195:
      pcVar15 = "malloc b_size of REF_INT NULL";
      uVar13 = 0x6dd;
      goto LAB_001c8264;
    }
    if (uVar21 != 0) {
      lVar11 = 0;
      auVar28 = _DAT_002034e0;
      auVar26 = _DAT_002034b0;
      do {
        auVar29 = auVar26 ^ auVar2;
        if ((bool)(~(auVar29._4_4_ == iVar9 && iVar3 < auVar29._0_4_ || iVar9 < auVar29._4_4_) & 1))
        {
          *(undefined4 *)((long)recv_size + lVar11) = 0;
        }
        if ((auVar29._12_4_ != iVar4 || auVar29._8_4_ <= auVar30._8_4_) && auVar29._12_4_ <= iVar4)
        {
          *(undefined4 *)((long)recv_size + lVar11 + 4) = 0;
        }
        auVar29 = auVar28 ^ auVar2;
        iVar10 = auVar29._4_4_;
        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar29._0_4_ <= iVar3)) {
          *(undefined4 *)((long)recv_size + lVar11 + 8) = 0;
          *(undefined4 *)((long)recv_size + lVar11 + 0xc) = 0;
        }
        lVar6 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar6 + 4;
        lVar6 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar6 + 4;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar11);
    }
  }
  uVar19 = (ulong)ref_node->max;
  if ((long)uVar19 < 1) {
    uVar23 = 0;
    iVar3 = 0;
  }
  else {
    uVar12 = 0;
    iVar9 = 0;
    do {
      if (-1 < ref_node->global[uVar12]) {
        iVar9 = iVar9 + (uint)(ref_node->ref_mpi->id == ref_node->part[uVar12]);
      }
      uVar12 = uVar12 + 1;
    } while (uVar19 != uVar12);
    uVar23 = 0;
    iVar3 = (int)(0x7fffffff / uVar21);
    if (iVar9 < iVar3) {
      iVar3 = iVar9;
    }
    if (0 < ref_node->max) {
      pRVar1 = ref_node->global;
      uVar21 = 0;
      uVar23 = 0;
      iVar9 = 0;
      do {
        if (((-1 < pRVar1[uVar21]) && (ref_node->ref_mpi->id == ref_node->part[uVar21])) &&
           (iVar9 < iVar3)) {
          iVar16 = (int)(iVar3 + uVar5 + -1) / (int)uVar5;
          iVar14 = iVar9 / iVar16;
          iVar4 = (iVar3 + -1) / (int)uVar5;
          iVar10 = iVar3 - iVar4 * uVar5;
          if (iVar10 <= iVar14) {
            iVar14 = (iVar9 - iVar16 * iVar10) / iVar4 + iVar10;
          }
          if (ref_mpi->id == iVar14) {
            uVar23 = uVar23 + 1;
          }
          else {
            send_size[iVar14] = send_size[iVar14] + 1;
          }
          iVar9 = iVar9 + 1;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar19);
      if ((int)uVar23 < 0) {
        pcVar15 = "malloc stationary of REF_INT negative";
        uVar13 = 0x6f8;
        goto LAB_001c800d;
      }
    }
  }
  __s = malloc((ulong)uVar23 << 2);
  if (__s == (void *)0x0) {
    pcVar15 = "malloc stationary of REF_INT NULL";
    uVar13 = 0x6f8;
    goto LAB_001c8264;
  }
  if (uVar23 != 0) {
    memset(__s,0xff,(ulong)uVar23 << 2);
  }
  uVar5 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar5 != 0) {
    pcVar15 = "alltoall sizes";
    uVar13 = 0x6fb;
    goto LAB_001c8237;
  }
  uVar5 = ref_mpi->n;
  lVar11 = (long)(int)uVar5;
  if (lVar11 < 1) {
    uVar23 = 0;
  }
  else {
    lVar6 = 0;
    uVar23 = 0;
    do {
      uVar23 = uVar23 + send_size[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
    if ((int)uVar23 < 0) {
      pcVar15 = "malloc a_xyz of REF_DBL negative";
      uVar13 = 0x6ff;
      goto LAB_001c800d;
    }
  }
  pvVar7 = malloc((ulong)(uVar23 * 3) << 3);
  if (pvVar7 == (void *)0x0) {
    pcVar15 = "malloc a_xyz of REF_DBL NULL";
    uVar13 = 0x6ff;
  }
  else {
    local_90 = pvVar7;
    pvVar7 = malloc((ulong)uVar23 << 3);
    if (pvVar7 == (void *)0x0) {
      pcVar15 = "malloc a_dist of REF_DBL NULL";
      uVar13 = 0x700;
      goto LAB_001c8264;
    }
    if ((int)uVar5 < 1) {
      uVar21 = 0;
    }
    else {
      lVar6 = 0;
      uVar21 = 0;
      do {
        uVar23 = (int)uVar21 + recv_size[lVar6];
        uVar21 = (ulong)uVar23;
        lVar6 = lVar6 + 1;
      } while (lVar11 != lVar6);
      if ((int)uVar23 < 0) {
        pcVar15 = "malloc b_xyz of REF_DBL negative";
        uVar13 = 0x704;
        goto LAB_001c800d;
      }
    }
    pRVar8 = (REF_DBL *)malloc((ulong)(uint)((int)uVar21 * 3) << 3);
    if (pRVar8 == (REF_DBL *)0x0) {
      pcVar15 = "malloc b_xyz of REF_DBL NULL";
      uVar13 = 0x704;
    }
    else {
      local_a0 = uVar21;
      local_98 = pRVar8;
      pRVar8 = (REF_DBL *)malloc(uVar21 * 8);
      if (pRVar8 == (REF_DBL *)0x0) {
        pcVar15 = "malloc b_dist of REF_DBL NULL";
        uVar13 = 0x705;
      }
      else {
        if ((int)uVar5 < 0) {
          pcVar15 = "malloc a_next of REF_INT negative";
          uVar13 = 0x707;
LAB_001c800d:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar13,"ref_phys_wall_distance",pcVar15);
          return 1;
        }
        local_c0 = pRVar8;
        __ptr = (undefined4 *)malloc(lVar11 * 4);
        if (__ptr != (undefined4 *)0x0) {
          *__ptr = 0;
          if (1 < uVar5) {
            lVar6 = 0;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + send_size[lVar6];
              __ptr[lVar6 + 1] = iVar9;
              lVar6 = lVar6 + 1;
            } while (lVar11 + -1 != lVar6);
          }
          iVar9 = ref_node->max;
          if ((long)iVar9 < 1) {
            local_e8 = 0;
          }
          else {
            pRVar1 = ref_node->global;
            iVar4 = iVar3 + uVar5 + -1;
            in_stack_fffffffffffffed0 =
                 (REF_DBL **)CONCAT44((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),iVar4);
            lVar6 = 0;
            lVar11 = 0;
            local_e8 = 0;
            iVar10 = 0;
            do {
              if (((-1 < pRVar1[lVar11]) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) &&
                 (iVar10 < iVar3)) {
                iVar17 = iVar4 / (int)uVar5;
                iVar16 = iVar10 / iVar17;
                iVar14 = (iVar3 + -1) / (int)uVar5;
                iVar20 = iVar3 - iVar14 * uVar5;
                if (iVar20 <= iVar16) {
                  iVar16 = (iVar10 - iVar17 * iVar20) / iVar14 + iVar20;
                }
                if (ref_mpi->id == iVar16) {
                  *(int *)((long)__s + (long)(int)local_e8 * 4) = (int)lVar11;
                  local_e8 = (ulong)((int)local_e8 + 1);
                }
                else {
                  iVar14 = __ptr[iVar16];
                  pRVar8 = ref_node->real;
                  lVar18 = 0;
                  do {
                    *(undefined8 *)((long)local_90 + lVar18 * 8 + (long)iVar14 * 0x18) =
                         *(undefined8 *)((long)pRVar8 + lVar18 * 8 + lVar6);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  __ptr[iVar16] = iVar14 + 1;
                }
                iVar10 = iVar10 + 1;
              }
              lVar11 = lVar11 + 1;
              lVar6 = lVar6 + 0x78;
            } while (lVar11 != iVar9);
          }
          local_a8 = pvVar7;
          uVar5 = ref_mpi_alltoallv(ref_mpi,local_90,send_size,local_98,recv_size,3,3);
          auVar2 = _DAT_002034c0;
          if (uVar5 == 0) {
            if ((int)local_a0 != 0) {
              lVar11 = uVar21 - 1;
              auVar24._8_4_ = (int)lVar11;
              auVar24._0_8_ = lVar11;
              auVar24._12_4_ = (int)((ulong)lVar11 >> 0x20);
              uVar19 = 0;
              auVar24 = auVar24 ^ _DAT_002034c0;
              auVar27 = _DAT_002034b0;
              do {
                auVar29 = auVar27 ^ auVar2;
                if ((bool)(~(auVar29._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar29._0_4_ ||
                            auVar24._4_4_ < auVar29._4_4_) & 1)) {
                  *(undefined8 *)((long)local_c0 + uVar19) = 0x6974e718d7d7625a;
                }
                if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
                    auVar29._12_4_ <= auVar24._12_4_) {
                  *(undefined8 *)((long)local_c0 + uVar19 + 8) = 0x6974e718d7d7625a;
                }
                lVar11 = auVar27._8_8_;
                auVar27._0_8_ = auVar27._0_8_ + 2;
                auVar27._8_8_ = lVar11 + 2;
                uVar19 = uVar19 + 0x10;
              } while ((uVar21 * 8 + 8 & 0xfffffffffffffff0) != uVar19);
            }
            iVar9 = ref_node->max;
            if (0 < (long)iVar9) {
              pRVar1 = ref_node->global;
              lVar11 = 0;
              do {
                if (-1 < pRVar1[lVar11]) {
                  distance[lVar11] = 1e+200;
                }
                lVar11 = lVar11 + 1;
              } while (iVar9 != lVar11);
            }
            uVar5 = ref_phys_local_wall(local_78,ref_dict,(REF_INT *)&local_80,&local_7c,&local_50);
            if (uVar5 == 0) {
              if (max_ncell != local_80) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x72d,"ref_phys_wall_distance","node_per miss match",(ulong)max_ncell,
                       (long)(int)local_80);
                return 1;
              }
              if ((long)ref_mpi->n < 0) {
                pcVar15 = "malloc part_ncell of REF_INT negative";
                uVar13 = 0x72f;
                goto LAB_001c800d;
              }
              part_ncell = (REF_INT *)malloc((long)ref_mpi->n << 2);
              if (part_ncell == (REF_INT *)0x0) {
                pcVar15 = "malloc part_ncell of REF_INT NULL";
                uVar13 = 0x72f;
                goto LAB_001c8264;
              }
              uVar5 = ref_mpi_allgather(ref_mpi,&local_7c,part_ncell,1);
              if (uVar5 == 0) {
                local_c8 = 0;
                local_b0 = local_50;
                if (0 < ref_mpi->n) {
                  local_84 = max_ncell * 3;
                  local_70 = 1;
                  if (1 < (int)local_a0) {
                    local_70 = local_a0 & 0xffffffff;
                  }
                  local_68 = local_e8;
                  do {
                    local_d0 = (REF_DBL **)0x0;
                    local_c4 = 0;
                    uVar5 = ref_phys_bcast_parts
                                      (ref_mpi,&local_c8,part_ncell,max_ncell,(REF_INT)local_b0,
                                       (REF_DBL *)&local_c4,(REF_INT *)&local_d0,
                                       in_stack_fffffffffffffed0);
                    if (uVar5 != 0) {
                      pcVar15 = "bcast part";
                      uVar13 = 0x73b;
                      goto LAB_001c8237;
                    }
                    in_stack_fffffffffffffed0 = (REF_DBL **)(ulong)local_c4;
                    uVar5 = ref_search_create(&local_b8,local_c4);
                    if (uVar5 != 0) {
                      pcVar15 = "make search";
                      uVar13 = 0x73d;
                      goto LAB_001c8237;
                    }
                    if ((int)in_stack_fffffffffffffed0 < 0) {
                      pcVar15 = "malloc permutation of REF_INT negative";
                      uVar13 = 0x73e;
                      goto LAB_001c800d;
                    }
                    permutation = (REF_INT *)malloc((long)in_stack_fffffffffffffed0 * 4);
                    if (permutation == (REF_INT *)0x0) {
                      pcVar15 = "malloc permutation of REF_INT NULL";
                      uVar13 = 0x73e;
                      goto LAB_001c8264;
                    }
                    uVar5 = ref_sort_shuffle((REF_INT)in_stack_fffffffffffffed0,permutation);
                    if (uVar5 != 0) {
                      pcVar15 = "shuffle";
                      uVar13 = 0x740;
                      goto LAB_001c8237;
                    }
                    if (in_stack_fffffffffffffed0 != (REF_DBL **)0x0) {
                      local_60 = local_d0;
                      ppRVar22 = (REF_DBL **)0x0;
                      do {
                        item = permutation[(long)ppRVar22];
                        uVar5 = ref_node_bounding_sphere_xyz
                                          ((REF_DBL *)(local_60 + local_84 * item),max_ncell,
                                           local_48,&local_58);
                        if (uVar5 != 0) {
                          pcVar15 = "bound";
                          uVar13 = 0x745;
                          goto LAB_001c8237;
                        }
                        uVar5 = ref_search_insert(local_b8,item,local_48,local_58 * 1.00000001);
                        if (uVar5 != 0) {
                          pcVar15 = "ins";
                          uVar13 = 0x746;
                          goto LAB_001c8237;
                        }
                        ppRVar22 = (REF_DBL **)((long)ppRVar22 + 1);
                      } while (in_stack_fffffffffffffed0 != ppRVar22);
                    }
                    free(permutation);
                    pRVar8 = local_98;
                    distance_00 = local_c0;
                    uVar21 = local_70;
                    ppRVar22 = local_d0;
                    if ((int)local_a0 != 0) {
                      do {
                        in_stack_fffffffffffffed0 = ppRVar22;
                        uVar5 = ref_search_nearest_element
                                          (local_b8,max_ncell,(REF_DBL *)in_stack_fffffffffffffed0,
                                           pRVar8,distance_00);
                        if (uVar5 != 0) {
                          pcVar15 = "balanced candidates";
                          uVar13 = 0x74d;
                          goto LAB_001c8237;
                        }
                        uVar21 = uVar21 - 1;
                        pRVar8 = pRVar8 + 3;
                        distance_00 = distance_00 + 1;
                        ppRVar22 = in_stack_fffffffffffffed0;
                      } while (uVar21 != 0);
                    }
                    ppRVar22 = local_d0;
                    if (0 < (int)local_e8) {
                      uVar21 = 0;
                      do {
                        lVar11 = (long)*(int *)((long)__s + uVar21 * 4);
                        uVar5 = ref_search_nearest_element
                                          (local_b8,max_ncell,(REF_DBL *)ppRVar22,
                                           local_78->node->real + lVar11 * 0xf,distance + lVar11);
                        if (uVar5 != 0) {
                          pcVar15 = "stationary candidates";
                          uVar13 = 0x755;
                          goto LAB_001c8237;
                        }
                        uVar21 = uVar21 + 1;
                      } while (local_68 != uVar21);
                    }
                    uVar5 = ref_search_free(local_b8);
                    if (uVar5 != 0) {
                      pcVar15 = "free";
                      uVar13 = 0x757;
                      goto LAB_001c8237;
                    }
                    if (local_d0 != (REF_DBL **)0x0) {
                      free(local_d0);
                    }
                  } while (local_c8 < ref_mpi->n);
                }
                free(part_ncell);
                if (local_b0 != (REF_DBL *)0x0) {
                  free(local_b0);
                }
                uVar5 = ref_mpi_alltoallv(ref_mpi,local_c0,recv_size,local_a8,send_size,1,3);
                if (uVar5 == 0) {
                  *__ptr = 0;
                  iVar9 = ref_mpi->n;
                  if (1 < (long)iVar9) {
                    lVar11 = 0;
                    iVar4 = 0;
                    do {
                      iVar4 = iVar4 + send_size[lVar11];
                      __ptr[lVar11 + 1] = iVar4;
                      lVar11 = lVar11 + 1;
                    } while ((long)iVar9 + -1 != lVar11);
                  }
                  iVar4 = ref_node->max;
                  if (0 < (long)iVar4) {
                    pRVar1 = ref_node->global;
                    lVar11 = 0;
                    iVar10 = 0;
                    do {
                      if (((-1 < pRVar1[lVar11]) &&
                          (ref_node->ref_mpi->id == ref_node->part[lVar11])) && (iVar10 < iVar3)) {
                        iVar20 = (iVar3 + iVar9 + -1) / iVar9;
                        iVar17 = iVar10 / iVar20;
                        iVar14 = (iVar3 + -1) / iVar9;
                        iVar16 = iVar3 - iVar14 * iVar9;
                        if (iVar16 <= iVar17) {
                          iVar17 = (iVar10 - iVar20 * iVar16) / iVar14 + iVar16;
                        }
                        if (ref_mpi->id != iVar17) {
                          iVar14 = __ptr[iVar17];
                          distance[lVar11] = *(REF_DBL *)((long)local_a8 + (long)iVar14 * 8);
                          __ptr[iVar17] = iVar14 + 1;
                        }
                        iVar10 = iVar10 + 1;
                      }
                      lVar11 = lVar11 + 1;
                    } while (iVar4 != lVar11);
                  }
                  uVar5 = ref_node_ghost_dbl(ref_node,distance,1);
                  if (uVar5 == 0) {
                    free(local_c0);
                    free(local_98);
                    free(local_a8);
                    free(local_90);
                    free(__ptr);
                    free(__s);
                    free(recv_size);
                    free(send_size);
                    return 0;
                  }
                  pcVar15 = "ghost distance";
                  uVar13 = 0x776;
                }
                else {
                  pcVar15 = "alltoallv dist";
                  uVar13 = 0x761;
                }
              }
              else {
                pcVar15 = "allgather part ncell";
                uVar13 = 0x731;
              }
            }
            else {
              pcVar15 = "local wall";
              uVar13 = 0x72c;
            }
          }
          else {
            pcVar15 = "alltoallv xyz";
            uVar13 = 0x723;
          }
LAB_001c8237:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 uVar13,"ref_phys_wall_distance",(ulong)uVar5,pcVar15);
          return uVar5;
        }
        pcVar15 = "malloc a_next of REF_INT NULL";
        uVar13 = 0x707;
      }
    }
  }
LAB_001c8264:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar13,
         "ref_phys_wall_distance",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid, REF_DICT ref_dict,
                                          REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nowned, nbalance, nstationary, *stationary;
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_INT nnode, part;
  REF_INT a_total, b_total;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_DBL *a_xyz, *b_xyz;
  REF_DBL *a_dist, *b_dist;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  nowned = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nowned++;
    }
  }
  /* limit the nodes that are balanced to prevent all2all overload */
  nbalance = MIN(nowned, REF_INT_MAX / ref_mpi_n(ref_mpi));

  /* count the balanced nodes based on destination, count stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          nstationary++;
        } else {
          a_size[part]++;
        }
        nnode++;
      }
    }
  }
  ref_malloc_init(stationary, nstationary, REF_INT, REF_EMPTY);

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_xyz, 3 * a_total, REF_DBL);
  ref_malloc(a_dist, a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_xyz, 3 * b_total, REF_DBL);
  ref_malloc(b_dist, b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  /* fill the balanced nodes based on destination, fill stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          stationary[nstationary] = node;
          nstationary++;
        } else {
          for (i = 0; i < 3; i++) {
            a_xyz[i + 3 * a_next[part]] = ref_node_xyz(ref_node, i, node);
          }
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_xyz, a_size, b_xyz, b_size, 3, REF_DBL_TYPE),
      "alltoallv xyz");

  for (node = 0; node < b_total; node++) {
    b_dist[node] = REF_DBL_MAX;
  }
  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    /* permutation randomizes tree insertion to improve balance/reduce depth */
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);

    for (i = 0; i < b_total; i++) {
      RSS(ref_search_nearest_element(ref_search, node_per, xyz, &(b_xyz[3 * i]),
                                     &(b_dist[i])),
          "balanced candidates");
    }
    for (i = 0; i < nstationary; i++) {
      node = stationary[i];
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "stationary candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
  }

  ref_free(part_ncell);
  ref_free(local_xyz);

  RSS(ref_mpi_alltoallv(ref_mpi, b_dist, b_size, a_dist, a_size, 1,
                        REF_DBL_TYPE),
      "alltoallv dist");

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }
  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
        } else {
          distance[node] = a_dist[a_next[part]];
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, distance, 1), "ghost distance");

  ref_free(b_dist);
  ref_free(b_xyz);
  ref_free(a_dist);
  ref_free(a_xyz);
  ref_free(a_next);
  ref_free(stationary);
  ref_free(b_size);
  ref_free(a_size);
  return REF_SUCCESS;
}